

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O2

int str_gsub(lua_State *L)

{
  char cVar1;
  byte bVar2;
  lua_State *L_00;
  char cVar3;
  uint uVar4;
  int iVar5;
  char *s;
  char *p;
  char *e;
  char *pcVar6;
  ushort **ppuVar7;
  ulong uVar8;
  ulong uVar9;
  size_t lp;
  lua_State *local_22b8;
  ulong local_22b0;
  char *local_22a8;
  ulong local_22a0;
  ulong local_2298;
  size_t srcl;
  ulong local_2288;
  MatchState ms;
  luaL_Buffer b;
  
  s = luaL_checklstring(L,1,&srcl);
  p = luaL_checklstring(L,2,&lp);
  uVar4 = lua_type(L,3);
  uVar9 = (ulong)uVar4;
  local_22a0 = luaL_optinteger(L,4,srcl + 1);
  cVar1 = *p;
  if (3 < uVar4 - 3) {
    luaL_argerror(L,3,"string/function/table expected");
  }
  luaL_buffinit(L,&b);
  if (cVar1 == '^') {
    p = p + 1;
    lp = lp - 1;
  }
  ms.matchdepth = 200;
  ms.src_end = s + srcl;
  ms.p_end = p + lp;
  uVar8 = 0;
  local_22b8 = L;
  local_22b0 = uVar9;
  local_22a8 = p;
  ms.src_init = s;
  ms.L = L;
  do {
    e = s;
    if (local_22a0 <= uVar8) break;
    ms.level = 0;
    e = match(&ms,s,p);
    L_00 = ms.L;
    if (e == (char *)0x0) {
LAB_001182f1:
      e = s;
      if (ms.src_end <= s) break;
      if (b.size <= b.n) {
        luaL_prepbuffsize(&b,1);
      }
      e = s + 1;
      b.b[b.n] = *s;
      b.n = b.n + 1;
    }
    else {
      local_2298 = uVar8;
      if ((int)uVar9 == 5) {
        push_onecapture(&ms,0,s,e);
        lua_gettable(L_00,3);
LAB_00118106:
        iVar5 = lua_toboolean(L_00,-1);
        if (iVar5 == 0) {
          lua_settop(L_00,-2);
          lua_pushlstring(L_00,s,(long)e - (long)s);
        }
        else {
          iVar5 = lua_isstring(L_00,-1);
          if (iVar5 == 0) {
            iVar5 = lua_type(L_00,-1);
            pcVar6 = lua_typename(L_00,iVar5);
            luaL_error(L_00,"invalid replacement value (a %s)",pcVar6);
          }
        }
        luaL_addvalue(&b);
      }
      else {
        if ((int)uVar9 == 6) {
          lua_pushvalue(ms.L,3);
          iVar5 = push_captures(&ms,s,e);
          lua_callk(L_00,iVar5,1,0,(lua_CFunction)0x0);
          goto LAB_00118106;
        }
        pcVar6 = lua_tolstring(ms.L,3,&local_2288);
        uVar8 = 0;
        while (p = local_22a8, uVar9 = local_22b0, uVar8 < local_2288) {
          cVar3 = pcVar6[uVar8];
          if (cVar3 == '%') {
            uVar9 = uVar8 + 1;
            ppuVar7 = __ctype_b_loc();
            bVar2 = pcVar6[uVar8 + 1];
            if ((*(byte *)((long)*ppuVar7 + (ulong)bVar2 * 2 + 1) & 8) == 0) {
              if (bVar2 != 0x25) {
                luaL_error(ms.L,"invalid use of \'%c\' in replacement string",0x25);
              }
              if (b.size <= b.n) {
                luaL_prepbuffsize(&b,1);
              }
              b.b[b.n] = pcVar6[uVar9];
              b.n = b.n + 1;
            }
            else if (bVar2 == 0x30) {
              luaL_addlstring(&b,s,(long)e - (long)s);
            }
            else {
              push_onecapture(&ms,(char)bVar2 + -0x31,s,e);
              luaL_addvalue(&b);
            }
          }
          else {
            if (b.size <= b.n) {
              luaL_prepbuffsize(&b,1);
              cVar3 = pcVar6[uVar8];
            }
            b.b[b.n] = cVar3;
            uVar9 = uVar8;
            b.n = b.n + 1;
          }
          uVar8 = uVar9 + 1;
        }
      }
      uVar8 = local_2298 + 1;
      if (e <= s) goto LAB_001182f1;
    }
    s = e;
  } while (cVar1 != '^');
  luaL_addlstring(&b,e,(long)ms.src_end - (long)e);
  luaL_pushresult(&b);
  lua_pushinteger(local_22b8,uVar8);
  return 2;
}

Assistant:

static int str_gsub (lua_State *L) {
  size_t srcl, lp;
  const char *src = luaL_checklstring(L, 1, &srcl);
  const char *p = luaL_checklstring(L, 2, &lp);
  int tr = lua_type(L, 3);
  size_t max_s = luaL_optinteger(L, 4, srcl+1);
  int anchor = (*p == '^');
  size_t n = 0;
  MatchState ms;
  luaL_Buffer b;
  luaL_argcheck(L, tr == LUA_TNUMBER || tr == LUA_TSTRING ||
                   tr == LUA_TFUNCTION || tr == LUA_TTABLE, 3,
                      "string/function/table expected");
  luaL_buffinit(L, &b);
  if (anchor) {
    p++; lp--;  /* skip anchor character */
  }
  ms.L = L;
  ms.matchdepth = MAXCCALLS;
  ms.src_init = src;
  ms.src_end = src+srcl;
  ms.p_end = p + lp;
  while (n < max_s) {
    const char *e;
    ms.level = 0;
    lua_assert(ms.matchdepth == MAXCCALLS);
    e = match(&ms, src, p);
    if (e) {
      n++;
      add_value(&ms, &b, src, e, tr);
    }
    if (e && e>src) /* non empty match? */
      src = e;  /* skip it */
    else if (src < ms.src_end)
      luaL_addchar(&b, *src++);
    else break;
    if (anchor) break;
  }
  luaL_addlstring(&b, src, ms.src_end-src);
  luaL_pushresult(&b);
  lua_pushinteger(L, n);  /* number of substitutions */
  return 2;
}